

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::fboc::details::attTypeName_abi_cxx11_
          (string *__return_storage_ptr__,details *this,GLenum bufType)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 == 0x8d41) {
    pcVar3 = "rbo";
    pcVar1 = "";
  }
  else if (iVar2 == 0x1702) {
    pcVar3 = "tex";
    pcVar1 = "";
  }
  else if (iVar2 == 0) {
    pcVar3 = "none";
    pcVar1 = "";
  }
  else {
    pcVar1 = "";
    pcVar3 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string attTypeName (GLenum bufType)
{
	switch (bufType)
	{
		case GL_NONE:
			return "none";
		case GL_RENDERBUFFER:
			return "rbo";
		case GL_TEXTURE:
			return "tex";
		default:
			DE_FATAL("Impossible case");
	}
	return ""; // Shut up compiler
}